

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationBar::showNextScreen(NavigationBar *this)

{
  QStackedWidget *pQVar1;
  TextLabel *this_00;
  NavigationButton *pNVar2;
  QWidget *pQVar3;
  bool bVar4;
  NavigationBarPrivate *pNVar5;
  NavigationBarPrivate *pNVar6;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar7;
  NavigationItem *text;
  QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
  *pQVar8;
  QWidget *local_70;
  undefined1 local_68 [8];
  QSharedPointer<QtMWidgets::NavigationItem> item;
  QWidget *local_48;
  undefined1 local_40 [8];
  QSharedPointer<QtMWidgets::NavigationItem> currentItem;
  undefined1 local_28 [8];
  QSharedPointer<QtMWidgets::NavigationItem> nextItem;
  int nextIndex;
  NavigationBar *this_local;
  
  pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  bVar4 = QList<int>::isEmpty(&(pNVar5->forwardStack).super_QList<int>);
  if (!bVar4) {
    pQVar8 = &this->d;
    pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(pQVar8);
    nextItem.d._4_4_ = QStack<int>::pop(&pNVar5->forwardStack);
    pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(pQVar8);
    pNVar6 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(pQVar8);
    currentItem.d = (Data *)QStackedWidget::widget((int)pNVar6->stack);
    pQVar7 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&pNVar5->itemsMap,(QWidget **)&currentItem.d);
    QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28,pQVar7);
    pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(pQVar8);
    pNVar6 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(pQVar8);
    pQVar1 = pNVar6->stack;
    currentIndex(this);
    local_48 = (QWidget *)QStackedWidget::widget((int)pQVar1);
    pQVar7 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&pNVar5->itemsMap,&local_48);
    QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_40,pQVar7);
    pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    item.d._0_4_ = currentIndex(this);
    QStack<int>::push(&pNVar5->backStack,(int *)&item.d);
    pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    this_00 = pNVar5->title;
    text = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                     ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
    TextLabel::setText(this_00,&text->title);
    pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    pNVar2 = pNVar5->left;
    QSharedPointer<QtMWidgets::NavigationItem>::operator->
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_40);
    QAbstractButton::setText((QString *)pNVar2);
    QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
    ::operator->(&this->d);
    QWidget::show();
    pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    pQVar3 = (QWidget *)pNVar5->stack;
    QSharedPointer<QtMWidgets::NavigationItem>::operator->
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
    QStackedWidget::setCurrentWidget(pQVar3);
    pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    bVar4 = QList<int>::isEmpty(&(pNVar5->forwardStack).super_QList<int>);
    if (bVar4) {
      QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
      ::operator->(&this->d);
      QWidget::hide();
    }
    else {
      pQVar8 = &this->d;
      pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
               ::operator->(pQVar8);
      pNVar6 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
               ::operator->(pQVar8);
      pQVar1 = pNVar6->stack;
      pNVar6 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
               ::operator->(pQVar8);
      QStack<int>::top(&pNVar6->forwardStack);
      local_70 = (QWidget *)QStackedWidget::widget((int)pQVar1);
      pQVar7 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                         (&pNVar5->itemsMap,&local_70);
      QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
                ((QSharedPointer<QtMWidgets::NavigationItem> *)local_68,pQVar7);
      pNVar5 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
               ::operator->(&this->d);
      pNVar2 = pNVar5->right;
      QSharedPointer<QtMWidgets::NavigationItem>::operator->
                ((QSharedPointer<QtMWidgets::NavigationItem> *)local_68);
      QAbstractButton::setText((QString *)pNVar2);
      QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
                ((QSharedPointer<QtMWidgets::NavigationItem> *)local_68);
    }
    QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_40);
    QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
  }
  return;
}

Assistant:

void
NavigationBar::showNextScreen()
{
	if( !d->forwardStack.isEmpty() )
	{
		const int nextIndex = d->forwardStack.pop();
		QSharedPointer< NavigationItem > nextItem =
			d->itemsMap[ d->stack->widget( nextIndex ) ];
		QSharedPointer< NavigationItem > currentItem =
			d->itemsMap[ d->stack->widget( currentIndex() ) ];

		d->backStack.push( currentIndex() );

		d->title->setText( nextItem->title );

		d->left->setText( currentItem->title );
		d->left->show();

		d->stack->setCurrentWidget( nextItem->self );

		if( !d->forwardStack.isEmpty() )
		{
			QSharedPointer< NavigationItem > item =
				d->itemsMap[ d->stack->widget( d->forwardStack.top() ) ];

			d->right->setText( item->title );
		}
		else
			d->right->hide();
	}
}